

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::BeginRenderPass
          (DeviceContextVkImpl *this,BeginRenderPassAttribs *Attribs)

{
  bool bVar1;
  RenderPassVkImpl *pRVar2;
  Char *pCVar3;
  FramebufferVkImpl *pFVar4;
  VkRenderPass pVVar5;
  VkFramebuffer pVVar6;
  RenderPassDesc *pRVar7;
  uint *puVar8;
  long lVar9;
  reference pvVar10;
  TextureFormatAttribs *pTVar11;
  char (*in_RCX) [34];
  TextureFormatAttribs *FmtAttribs;
  VkClearValue *vkClearVal;
  OptimizedClearValue *ClearVal;
  Uint32 i;
  RenderPassDesc *RPDesc;
  VkClearValue *pVkClearValues;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  BeginRenderPassAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = Attribs;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BeginRenderPass
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs);
  pRVar2 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar2 == (RenderPassVkImpl *)0x0) {
    FormatString<char[26],char[31]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass != nullptr",(char (*) [31])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [34])0x7e6;
    DebugAssertionFailed
              (pCVar3,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e6);
    std::__cxx11::string::~string((string *)local_38);
  }
  pFVar4 = Diligent::RefCntAutoPtr::operator_cast_to_FramebufferVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer);
  if (pFVar4 == (FramebufferVkImpl *)0x0) {
    FormatString<char[26],char[31]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer != nullptr",(char (*) [31])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [34])0x7e7;
    DebugAssertionFailed
              (pCVar3,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e7);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (this->m_vkRenderPass != (VkRenderPass)0x0) {
    FormatString<char[26],char[33]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_vkRenderPass == VK_NULL_HANDLE",(char (*) [33])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [34])0x7e8;
    DebugAssertionFailed
              (pCVar3,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e8);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if (this->m_vkFramebuffer != (VkFramebuffer)0x0) {
    FormatString<char[26],char[34]>
              ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_vkFramebuffer == VK_NULL_HANDLE",in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [34])0x7e9;
    DebugAssertionFailed
              (pCVar3,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e9);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_DynamicRenderingInfo);
  if (bVar1) {
    FormatString<char[26],char[24]>
              ((string *)&pVkClearValues,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!m_DynamicRenderingInfo",(char (*) [24])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7ea);
    std::__cxx11::string::~string((string *)&pVkClearValues);
  }
  pRVar2 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  pVVar5 = RenderPassVkImpl::GetVkRenderPass(pRVar2);
  this->m_vkRenderPass = pVVar5;
  pFVar4 = RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer);
  pVVar6 = FramebufferVkImpl::GetVkFramebuffer(pFVar4);
  this->m_vkFramebuffer = pVVar6;
  RPDesc = (RenderPassDesc *)0x0;
  if (*(int *)(msg.field_2._8_8_ + 0x10) != 0) {
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::resize
              (&this->m_vkClearValues,(ulong)*(uint *)(msg.field_2._8_8_ + 0x10));
    pRVar2 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
    pRVar7 = DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                        *)pRVar2);
    for (ClearVal._4_4_ = 0;
        puVar8 = std::min<unsigned_int>(&pRVar7->AttachmentCount,(uint *)(msg.field_2._8_8_ + 0x10))
        , ClearVal._4_4_ < *puVar8; ClearVal._4_4_ = ClearVal._4_4_ + 1) {
      lVar9 = *(long *)(msg.field_2._8_8_ + 0x18) + (ulong)ClearVal._4_4_ * 0x1c;
      pvVar10 = std::vector<VkClearValue,_std::allocator<VkClearValue>_>::operator[]
                          (&this->m_vkClearValues,(ulong)ClearVal._4_4_);
      pTVar11 = GetTextureFormatAttribs(pRVar7->pAttachments[ClearVal._4_4_].Format);
      if ((pTVar11->ComponentType == COMPONENT_TYPE_DEPTH) ||
         (pTVar11->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)) {
        (pvVar10->depthStencil).depth = *(float *)(lVar9 + 0x14);
        (pvVar10->depthStencil).stencil = (uint)*(byte *)(lVar9 + 0x18);
      }
      else {
        (pvVar10->depthStencil).depth = *(float *)(lVar9 + 4);
        (pvVar10->depthStencil).stencil = *(uint32_t *)(lVar9 + 8);
        *(undefined4 *)((long)pvVar10 + 8) = *(undefined4 *)(lVar9 + 0xc);
        *(undefined4 *)((long)pvVar10 + 0xc) = *(undefined4 *)(lVar9 + 0x10);
      }
    }
    RPDesc = (RenderPassDesc *)
             std::vector<VkClearValue,_std::allocator<VkClearValue>_>::data(&this->m_vkClearValues);
  }
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::BeginRenderPass
            (&this->m_CommandBuffer,this->m_vkRenderPass,this->m_vkFramebuffer,
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight,
             *(uint32_t *)(msg.field_2._8_8_ + 0x10),(VkClearValue *)RPDesc);
  SetViewports(this,1,(Viewport *)0x0,0,0);
  (this->m_State).ShadingRateIsSet = false;
  return;
}

Assistant:

void DeviceContextVkImpl::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    TDeviceContextBase::BeginRenderPass(Attribs);

    VERIFY_EXPR(m_pActiveRenderPass != nullptr);
    VERIFY_EXPR(m_pBoundFramebuffer != nullptr);
    VERIFY_EXPR(m_vkRenderPass == VK_NULL_HANDLE);
    VERIFY_EXPR(m_vkFramebuffer == VK_NULL_HANDLE);
    VERIFY_EXPR(!m_DynamicRenderingInfo);

    m_vkRenderPass  = m_pActiveRenderPass->GetVkRenderPass();
    m_vkFramebuffer = m_pBoundFramebuffer->GetVkFramebuffer();

    VkClearValue* pVkClearValues = nullptr;
    if (Attribs.ClearValueCount > 0)
    {
        m_vkClearValues.resize(Attribs.ClearValueCount);
        const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
        for (Uint32 i = 0; i < std::min(RPDesc.AttachmentCount, Attribs.ClearValueCount); ++i)
        {
            const OptimizedClearValue& ClearVal   = Attribs.pClearValues[i];
            VkClearValue&              vkClearVal = m_vkClearValues[i];

            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[i].Format);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
            {
                vkClearVal.depthStencil.depth   = ClearVal.DepthStencil.Depth;
                vkClearVal.depthStencil.stencil = ClearVal.DepthStencil.Stencil;
            }
            else
            {
                vkClearVal.color.float32[0] = ClearVal.Color[0];
                vkClearVal.color.float32[1] = ClearVal.Color[1];
                vkClearVal.color.float32[2] = ClearVal.Color[2];
                vkClearVal.color.float32[3] = ClearVal.Color[3];
            }
        }
        pVkClearValues = m_vkClearValues.data();
    }

    EnsureVkCmdBuffer();
    m_CommandBuffer.BeginRenderPass(m_vkRenderPass, m_vkFramebuffer, m_FramebufferWidth, m_FramebufferHeight, Attribs.ClearValueCount, pVkClearValues);

    // Set the viewport to match the framebuffer size
    SetViewports(1, nullptr, 0, 0);

    m_State.ShadingRateIsSet = false;
}